

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

char * __thiscall FBehavior::LookupString(FBehavior *this,DWORD index)

{
  DWORD *list_1;
  DWORD *list;
  DWORD index_local;
  FBehavior *this_local;
  
  if (this->StringTable == 0) {
    this_local = (FBehavior *)0x0;
  }
  else if (this->Format == ACS_Old) {
    if (index < *(uint *)(this->Data + this->StringTable)) {
      this_local = (FBehavior *)
                   (this->Data +
                   *(uint *)((long)(this->Data + this->StringTable) + (ulong)(index + 1) * 4));
    }
    else {
      this_local = (FBehavior *)0x0;
    }
  }
  else if (index < *(uint *)(this->Data + (ulong)this->StringTable + 4)) {
    this_local = (FBehavior *)
                 (this->Data +
                 (ulong)*(uint *)(this->Data + (ulong)(index + 3) * 4 + (ulong)this->StringTable) +
                 (ulong)this->StringTable);
  }
  else {
    this_local = (FBehavior *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char *FBehavior::LookupString (DWORD index) const
{
	if (StringTable == 0)
	{
		return NULL;
	}
	if (Format == ACS_Old)
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[0])
			return NULL;	// Out of range for this list;
		return (const char *)(Data + list[1+index]);
	}
	else
	{
		DWORD *list = (DWORD *)(Data + StringTable);

		if (index >= list[1])
			return NULL;	// Out of range for this list
		return (const char *)(Data + StringTable + list[3+index]);
	}
}